

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitmapIndexBuilder.cpp
# Opt level: O0

void __thiscall BitmapIndexBuilder::save(BitmapIndexBuilder *this,string *fname)

{
  allocator_type *out_00;
  reference pvVar1;
  unsigned_long *puVar2;
  _Ios_Openmode in_ESI;
  IndexBuilder *in_RDI;
  undefined1 auVar3 [16];
  TriGram i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> offsets;
  uint64_t offset;
  uint32_t reserved;
  uint32_t ndx_type;
  uint32_t version;
  uint32_t magic;
  ofstream out;
  allocator_type *in_stack_fffffffffffffd40;
  size_type in_stack_fffffffffffffd48;
  allocator_type *paVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  uint local_268;
  undefined1 local_261 [25];
  fpos local_248 [16];
  allocator_type *local_238;
  undefined4 local_22c;
  IndexType local_228 [6];
  long local_210 [64];
  _Ios_Openmode local_10;
  
  local_10 = in_ESI;
  std::ofstream::ofstream(local_210);
  std::ios::exceptions((int)local_210 + (int)*(undefined8 *)(local_210[0] + -0x18));
  std::ofstream::open((string *)local_210,local_10);
  local_228[2] = 0xca7da7a;
  local_228[1] = 6;
  local_228[0] = IndexBuilder::index_type(in_RDI);
  local_22c = 0;
  std::ostream::write((char *)local_210,(long)(local_228 + 2));
  std::ostream::write((char *)local_210,(long)(local_228 + 1));
  std::ostream::write((char *)local_210,(long)local_228);
  std::ostream::write((char *)local_210,(long)&local_22c);
  auVar3 = std::ostream::tellp();
  local_248 = (fpos  [16])auVar3;
  out_00 = (allocator_type *)std::fpos::operator_cast_to_long(local_248);
  this_00 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_261;
  local_238 = out_00;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x20c1ec);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (this_00,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x20c20c);
  for (local_268 = 0; paVar4 = local_238, local_268 < 0x1000000; local_268 = local_268 + 1) {
    pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_261 + 1),
                        (ulong)local_268);
    *pvVar1 = (value_type)paVar4;
    get_run(auVar3._0_8_,auVar3._12_4_);
    in_stack_fffffffffffffd40 = (allocator_type *)compress_run(auVar3._8_8_,(ostream *)out_00);
    local_238 = in_stack_fffffffffffffd40 + (long)local_238;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffd40);
  }
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_261 + 1),
                      0x1000000);
  *pvVar1 = (value_type)paVar4;
  puVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x20c34c);
  std::ostream::write((char *)local_210,(long)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffd40);
  std::ofstream::~ofstream(local_210);
  return;
}

Assistant:

void BitmapIndexBuilder::save(const std::string &fname) {
    std::ofstream out;
    out.exceptions(std::ofstream::badbit);
    out.open(fname, std::ofstream::binary);

    uint32_t magic = DB_MAGIC;
    uint32_t version = 6;
    auto ndx_type = static_cast<uint32_t>(index_type());
    uint32_t reserved = 0;

    out.write(reinterpret_cast<char *>(&magic), 4);
    out.write(reinterpret_cast<char *>(&version), 4);
    out.write(reinterpret_cast<char *>(&ndx_type), 4);
    out.write(reinterpret_cast<char *>(&reserved), 4);

    auto offset = static_cast<uint64_t>(out.tellp());
    std::vector<uint64_t> offsets(NUM_TRIGRAMS + 1);

    for (TriGram i = 0; i < NUM_TRIGRAMS; i++) {
        offsets[i] = offset;
        offset += compress_run(get_run(i), out);
    }

    offsets[NUM_TRIGRAMS] = offset;

    out.write(reinterpret_cast<char *>(offsets.data()),
              (NUM_TRIGRAMS + 1) * sizeof(uint64_t));
}